

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookiejar.cpp
# Opt level: O1

bool __thiscall QNetworkCookieJar::deleteCookie(QNetworkCookieJar *this,QNetworkCookie *cookie)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  QNetworkCookie *this_00;
  const_iterator abegin;
  QNetworkCookie *pQVar5;
  
  lVar1 = *(long *)(this + 8);
  pQVar5 = *(QNetworkCookie **)(lVar1 + 0x80);
  lVar3 = *(long *)(lVar1 + 0x88);
  lVar4 = lVar3 >> 2;
  this_00 = pQVar5;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
      abegin.i = this_00;
      if (bVar2) goto LAB_0018bd83;
      bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 1,cookie);
      abegin.i = this_00 + 1;
      if (bVar2) goto LAB_0018bd83;
      bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 2,cookie);
      abegin.i = this_00 + 2;
      if (bVar2) goto LAB_0018bd83;
      bVar2 = QNetworkCookie::hasSameIdentifier(this_00 + 3,cookie);
      abegin.i = this_00 + 3;
      if (bVar2) goto LAB_0018bd83;
      this_00 = this_00 + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  pQVar5 = pQVar5 + lVar3;
  lVar3 = (long)pQVar5 - (long)this_00 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      abegin.i = pQVar5;
      if ((lVar3 != 3) ||
         (bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie), abegin.i = this_00, bVar2))
      goto LAB_0018bd83;
      this_00 = this_00 + 1;
    }
    bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
    abegin.i = this_00;
    if (bVar2) goto LAB_0018bd83;
    this_00 = this_00 + 1;
  }
  bVar2 = QNetworkCookie::hasSameIdentifier(this_00,cookie);
  abegin.i = pQVar5;
  if (bVar2) {
    abegin.i = this_00;
  }
LAB_0018bd83:
  pQVar5 = (QNetworkCookie *)(*(long *)(lVar1 + 0x88) * 8 + *(long *)(lVar1 + 0x80));
  if (abegin.i != pQVar5) {
    QList<QNetworkCookie>::erase((QList<QNetworkCookie> *)(lVar1 + 0x78),abegin,abegin.i + 1);
  }
  return abegin.i != pQVar5;
}

Assistant:

bool QNetworkCookieJar::deleteCookie(const QNetworkCookie &cookie)
{
    Q_D(QNetworkCookieJar);
    const auto it = std::find_if(d->allCookies.cbegin(), d->allCookies.cend(),
                                 [&cookie](const auto &c) { return c.hasSameIdentifier(cookie); });
    if (it != d->allCookies.cend()) {
        d->allCookies.erase(it);
        return true;
    }
    return false;
}